

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_statemach_act(connectdata *conn)

{
  anon_union_224_10_26c073a1_for_proto *pp;
  int *piVar1;
  curl_off_t *pcVar2;
  curl_socket_t sockfd;
  curl_usessl cVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  _Bool _Var8;
  CURLcode CVar9;
  CURLcode CVar10;
  int iVar11;
  uint uVar12;
  imapstate iVar13;
  ulong uVar14;
  size_t sVar15;
  imapstate instate;
  size_t __n;
  char *pcVar16;
  Curl_easy *pCVar17;
  char *pcVar18;
  int imapcode;
  size_t nread;
  CURLcode local_6c;
  ulong local_68;
  ulong local_60;
  undefined8 local_58;
  SASL *local_40;
  size_t local_38;
  
  sockfd = conn->sock[0];
  local_38 = 0;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    CVar9 = imap_perform_upgrade_tls(conn);
    return CVar9;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar9 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar9;
  }
  local_40 = &(conn->proto).imapc.sasl;
  do {
    CVar9 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,(int *)&local_6c,&local_38);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    if (local_6c == ~CURLE_OK) {
      return CURLE_FTP_WEIRD_SERVER_REPLY;
    }
    if (local_6c == CURLE_OK) {
      return CURLE_OK;
    }
    switch((conn->proto).imapc.state) {
    case IMAP_SERVERGREET:
      if (local_6c != CURLE_SSH) {
        Curl_failf(conn->data,"Got unexpected imap-server response");
        return CURLE_FTP_WEIRD_SERVER_REPLY;
      }
      (conn->proto).ftpc.diralloc = 0;
      *(undefined4 *)((long)&conn->proto + 0x8c) = 0;
      (conn->proto).imapc.tls_supported = false;
      CVar9 = imap_sendf(conn,"CAPABILITY");
      iVar13 = IMAP_CAPABILITY;
joined_r0x0013b929:
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      (conn->proto).imapc.state = iVar13;
      goto LAB_0013ba39;
    case IMAP_CAPABILITY:
      pCVar17 = conn->data;
      if (local_6c == CURLE_SSH) {
        cVar3 = (pCVar17->set).use_ssl;
        if ((cVar3 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
          if ((conn->proto).imapc.tls_supported == true) {
            CVar9 = imap_sendf(conn,"STARTTLS");
            iVar13 = IMAP_STARTTLS;
            goto joined_r0x0013b929;
          }
          if (cVar3 != CURLUSESSL_TRY) {
            Curl_failf(pCVar17,"STARTTLS not supported.");
            return CURLE_USE_SSL_FAILED;
          }
        }
      }
      else if (local_6c == CURLE_ABORTED_BY_CALLBACK) {
        pcVar18 = (pCVar17->state).buffer + 2;
LAB_0013b737:
        do {
          uVar14 = (ulong)(byte)*pcVar18;
          if (uVar14 < 0x21) {
            if ((0x100002600U >> (uVar14 & 0x3f) & 1) != 0) {
              pcVar18 = pcVar18 + 1;
              goto LAB_0013b737;
            }
            if (uVar14 == 0) goto LAB_0013ba27;
          }
          sVar15 = 0xfffffffffffffffb;
          while ((0x20 < (byte)uVar14 || ((0x100002601U >> (uVar14 & 0x3f) & 1) == 0))) {
            lVar6 = sVar15 + 6;
            sVar15 = sVar15 + 1;
            uVar14 = (ulong)(byte)pcVar18[lVar6];
          }
          uVar14 = sVar15 + 5;
          if (uVar14 == 7) {
            if (*(int *)(pcVar18 + 3) != 0x52492d4c || *(int *)pcVar18 != 0x4c534153)
            goto LAB_0013b817;
            (conn->proto).imapc.ir_supported = true;
            uVar14 = 7;
          }
          else if (uVar14 == 0xd) {
            if (*(long *)(pcVar18 + 5) != 0x44454c4241534944 ||
                *(long *)pcVar18 != 0x5349444e49474f4c) goto LAB_0013b817;
            (conn->proto).imapc.login_disabled = true;
            uVar14 = 0xd;
          }
          else if (uVar14 == 8) {
            if (*(long *)pcVar18 != 0x534c545452415453) goto LAB_0013b817;
            (conn->proto).imapc.tls_supported = true;
            uVar14 = 8;
          }
          else if (5 < uVar14) {
LAB_0013b817:
            if (pcVar18[4] == 0x3d && *(int *)pcVar18 == 0x48545541) {
              pcVar18 = pcVar18 + 5;
              uVar12 = Curl_sasl_decode_mech(pcVar18,sVar15,&local_58);
              uVar14 = sVar15;
              if ((uVar12 != 0) && (CONCAT44(local_58._4_4_,(saslprogress)local_58) == sVar15)) {
                piVar1 = &(conn->proto).ftpc.diralloc;
                *piVar1 = *piVar1 | uVar12;
              }
            }
          }
          pcVar18 = pcVar18 + uVar14;
        } while( true );
      }
LAB_0013ba13:
      CVar10 = imap_perform_authentication(conn);
      break;
    case IMAP_STARTTLS:
      if (local_6c != CURLE_SSH) {
        if ((conn->data->set).use_ssl != CURLUSESSL_TRY) {
          Curl_failf(conn->data,"STARTTLS denied. %c",(ulong)local_6c);
          return CURLE_USE_SSL_FAILED;
        }
        goto LAB_0013ba13;
      }
      CVar10 = imap_perform_upgrade_tls(conn);
      break;
    default:
      goto switchD_0013b5b4_caseD_4;
    case IMAP_AUTHENTICATE:
      pCVar17 = conn->data;
      CVar10 = Curl_sasl_continue(local_40,conn,local_6c,(saslprogress *)&local_58);
      if (CVar10 == CURLE_OK) {
        if ((saslprogress)local_58 == SASL_IDLE) {
          if (((conn->proto).imapc.login_disabled != false) ||
             ((*(byte *)((long)&conn->proto + 0x98) & 1) == 0)) {
            pcVar18 = "Authentication cancelled";
            goto LAB_0013b9ea;
          }
          CVar10 = imap_perform_login(conn);
        }
        else {
          CVar10 = CURLE_OK;
          CVar9 = CURLE_OK;
          if ((saslprogress)local_58 == SASL_DONE) goto LAB_0013b9c2;
        }
      }
      break;
    case IMAP_LOGIN:
      if (local_6c != CURLE_SSH) {
        Curl_failf(conn->data,"Access denied. %c",(ulong)local_6c);
        return CURLE_LOGIN_DENIED;
      }
      goto switchD_0013b5b4_caseD_4;
    case IMAP_LIST:
    case IMAP_SEARCH:
      CVar10 = imap_state_listsearch_resp(conn,local_6c,instate);
      break;
    case IMAP_SELECT:
      pCVar17 = conn->data;
      if (local_6c == CURLE_SSH) {
        pvVar4 = (pCVar17->req).protop;
        if (((*(char **)((long)pvVar4 + 0x10) == (char *)0x0) ||
            (pcVar18 = (conn->proto).imapc.mailbox_uidvalidity, pcVar18 == (char *)0x0)) ||
           (iVar11 = strcmp(*(char **)((long)pvVar4 + 0x10),pcVar18), iVar11 == 0)) {
          pcVar18 = (*Curl_cstrdup)(*(char **)((long)pvVar4 + 8));
          (conn->proto).imapc.mailbox = pcVar18;
          if (*(long *)((long)pvVar4 + 0x38) == 0) {
            if (*(long *)((long)pvVar4 + 0x30) == 0) {
              CVar10 = imap_perform_fetch(conn);
            }
            else {
              CVar10 = imap_perform_search(conn);
            }
          }
          else {
            CVar10 = imap_perform_list(conn);
          }
        }
        else {
          Curl_failf(pCVar17,"Mailbox UIDVALIDITY has changed");
          CVar10 = CURLE_REMOTE_FILE_NOT_FOUND;
        }
      }
      else if (local_6c == CURLE_ABORTED_BY_CALLBACK) {
        CVar10 = CURLE_OK;
        iVar11 = __isoc99_sscanf((pCVar17->state).buffer + 2,"OK [UIDVALIDITY %19[0123456789]]",
                                 &local_58);
        if (iVar11 == 1) {
          (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
          (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
          pcVar18 = (*Curl_cstrdup)((char *)&local_58);
          (conn->proto).imapc.mailbox_uidvalidity = pcVar18;
        }
      }
      else {
        pcVar18 = "Select failed";
LAB_0013b9ea:
        Curl_failf(pCVar17,pcVar18);
        CVar10 = CURLE_LOGIN_DENIED;
      }
      break;
    case IMAP_FETCH:
      pCVar17 = conn->data;
      if (local_6c == CURLE_ABORTED_BY_CALLBACK) {
        pcVar18 = (pCVar17->state).buffer;
        pcVar16 = (pCVar17->state).buffer;
        while( true ) {
          pcVar16 = pcVar16 + 1;
          if (pcVar16[-1] == '\0') break;
          if (pcVar16[-1] == '{') {
            uVar14 = strtol(pcVar16,(char **)&local_58,10);
            pcVar16 = (char *)CONCAT44(local_58._4_4_,(saslprogress)local_58);
            if ((((1 < (long)pcVar16 - (long)pcVar18) && (*pcVar16 == '}')) && (pcVar16[1] == '\r'))
               && (pcVar16[2] == '\0')) {
              Curl_infof(pCVar17,"Found %llu bytes to download\n",uVar14);
              Curl_pgrsSetDownloadSize(pCVar17,uVar14);
              pcVar18 = (pp->ftpc).pp.cache;
              if (pcVar18 != (char *)0x0) {
                local_68 = (conn->proto).ftpc.pp.cache_size;
                if (uVar14 <= local_68) {
                  local_68 = uVar14;
                }
                local_60 = uVar14;
                CVar9 = Curl_client_write(conn,1,pcVar18,local_68);
                uVar14 = local_68;
                if (CVar9 != CURLE_OK) {
                  return CVar9;
                }
                pcVar2 = &(pCVar17->req).bytecount;
                *pcVar2 = *pcVar2 + local_68;
                Curl_infof(pCVar17,"Written %llu bytes, %llu bytes are left for transfer\n",local_68
                          );
                uVar7 = local_68;
                uVar5 = (conn->proto).ftpc.pp.cache_size;
                __n = uVar5 - uVar14;
                if (uVar5 < uVar14 || __n == 0) {
                  (*Curl_cfree)((pp->ftpc).pp.cache);
                  (pp->ftpc).pp.cache = (char *)0x0;
                  sVar15 = 0;
                }
                else {
                  memmove((conn->proto).generic,(void *)((long)(conn->proto).generic + local_68),__n
                         );
                  sVar15 = (conn->proto).ftpc.pp.cache_size - uVar7;
                }
                (conn->proto).ftpc.pp.cache_size = sVar15;
                uVar14 = local_60;
              }
              if ((pCVar17->req).bytecount == uVar14) {
                iVar11 = -1;
                uVar14 = 0xffffffffffffffff;
              }
              else {
                (pCVar17->req).maxdownload = uVar14;
                iVar11 = 0;
              }
              Curl_setup_transfer(conn,iVar11,uVar14,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
              CVar9 = CURLE_OK;
              goto LAB_0013b9c2;
            }
            break;
          }
          pcVar18 = pcVar18 + 1;
        }
        Curl_failf(((conn->proto).ftpc.pp.conn)->data,"Failed to parse FETCH response.");
        CVar9 = CURLE_FTP_WEIRD_SERVER_REPLY;
      }
      else {
        Curl_pgrsSetDownloadSize(pCVar17,-1);
        CVar9 = CURLE_REMOTE_FILE_NOT_FOUND;
      }
LAB_0013b9c2:
      CVar10 = CVar9;
      (conn->proto).imapc.state = IMAP_STOP;
      break;
    case IMAP_FETCH_FINAL:
      if (local_6c != CURLE_SSH) {
        return CURLE_FTP_WEIRD_SERVER_REPLY;
      }
      goto switchD_0013b5b4_caseD_4;
    case IMAP_APPEND:
      if (local_6c == CURLE_BAD_FUNCTION_ARGUMENT) {
        Curl_pgrsSetUploadSize(conn->data,(conn->data->state).infilesize);
        Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,0,(curl_off_t *)0x0);
        (conn->proto).imapc.state = IMAP_STOP;
        return CURLE_OK;
      }
      return CURLE_UPLOAD_FAILED;
    case IMAP_APPEND_FINAL:
      if (local_6c != CURLE_SSH) {
        return CURLE_UPLOAD_FAILED;
      }
switchD_0013b5b4_caseD_4:
      (conn->proto).imapc.state = IMAP_STOP;
      return CURLE_OK;
    }
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
LAB_0013ba27:
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
LAB_0013ba39:
    _Var8 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var8) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode imap_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
  if(imapc->state == IMAP_UPGRADETLS)
    return imap_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_FTP_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE:
      result = imap_state_auth_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LIST:
      result = imap_state_listsearch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SEARCH:
      result = imap_state_listsearch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}